

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O0

Literals * wasm::Properties::getLiterals(Literals *__return_storage_ptr__,Expression *curr)

{
  initializer_list<wasm::Literal> init;
  bool bVar1;
  TupleMake *pTVar2;
  Expression **ppEVar3;
  Iterator IVar4;
  Literal *local_c8;
  Literal local_b0;
  Expression *local_98;
  Expression *op;
  Iterator __end4;
  Iterator __begin4;
  ExpressionList *__range4;
  TupleMake *tuple;
  undefined8 local_28;
  undefined8 local_20;
  Type local_18;
  Expression *curr_local;
  Literals *literals;
  
  local_18.id = (uintptr_t)curr;
  curr_local = (Expression *)__return_storage_ptr__;
  bVar1 = isSingleConstantExpression(curr);
  if (bVar1) {
    getLiteral((Literal *)&stack0xffffffffffffffc0,(Expression *)local_18.id);
    local_28 = &stack0xffffffffffffffc0;
    local_20 = (char *)0x1;
    init._M_len = 1;
    init._M_array = (iterator)local_28;
    Literals::Literals(__return_storage_ptr__,init);
    local_c8 = (Literal *)&stack0xffffffffffffffd8;
    do {
      local_c8 = local_c8 + -1;
      wasm::Literal::~Literal(local_c8);
    } while (local_c8 != (Literal *)&stack0xffffffffffffffc0);
  }
  else {
    pTVar2 = Expression::dynCast<wasm::TupleMake>((Expression *)local_18.id);
    if (pTVar2 == (TupleMake *)0x0) {
      handle_unreachable("non-constant expression",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/properties.h"
                         ,0x93);
    }
    Literals::Literals(__return_storage_ptr__);
    IVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                      (&(pTVar2->operands).
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    __end4.index = (size_t)IVar4.parent;
    IVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                      (&(pTVar2->operands).
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    while( true ) {
      __end4.parent = (ArenaVector<wasm::Expression_*> *)IVar4.index;
      op = (Expression *)IVar4.parent;
      bVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
              operator!=((Iterator *)&__end4.index,(Iterator *)&op);
      if (!bVar1) break;
      ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                operator*((Iterator *)&__end4.index);
      local_98 = *ppEVar3;
      getLiteral(&local_b0,local_98);
      SmallVector<wasm::Literal,_1UL>::push_back
                (&__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>,&local_b0);
      wasm::Literal::~Literal(&local_b0);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end4.index);
      IVar4.index = (size_t)__end4.parent;
      IVar4.parent = (ArenaVector<wasm::Expression_*> *)op;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline Literals getLiterals(const Expression* curr) {
  if (isSingleConstantExpression(curr)) {
    return {getLiteral(curr)};
  } else if (auto* tuple = curr->dynCast<TupleMake>()) {
    Literals literals;
    for (auto* op : tuple->operands) {
      literals.push_back(getLiteral(op));
    }
    return literals;
  } else {
    WASM_UNREACHABLE("non-constant expression");
  }
}